

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O0

Arguments * __thiscall
Corrade::Utility::Arguments::addSkippedPrefix(Arguments *this,string *prefix,string *help)

{
  bool bVar1;
  ostream *poVar2;
  Debug *pDVar3;
  Flags local_a9;
  Error local_a8;
  Entry *local_80;
  Entry *entry;
  Entry *__end2;
  Entry *__begin2;
  Array<Corrade::Utility::Arguments::Entry,_void_(*)(Corrade::Utility::Arguments::Entry_*,_unsigned_long)>
  *__range2;
  Flags local_49;
  Error local_48;
  string *local_20;
  string *help_local;
  string *prefix_local;
  Arguments *this_local;
  
  local_20 = help;
  help_local = prefix;
  prefix_local = (string *)this;
  bVar1 = skippedPrefix(this,prefix);
  if (bVar1) {
    poVar2 = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_49);
    Error::Error(&local_48,poVar2,local_49);
    pDVar3 = Debug::operator<<(&local_48.super_Debug,
                               "Utility::Arguments::addSkippedPrefix(): prefix");
    pDVar3 = operator<<<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                       (pDVar3,prefix);
    Debug::operator<<(pDVar3,"already added");
    Error::~Error(&local_48);
    abort();
  }
  __begin2 = (Entry *)&this->_entries;
  __end2 = Containers::
           Array<Corrade::Utility::Arguments::Entry,_void_(*)(Corrade::Utility::Arguments::Entry_*,_unsigned_long)>
           ::begin((Array<Corrade::Utility::Arguments::Entry,_void_(*)(Corrade::Utility::Arguments::Entry_*,_unsigned_long)>
                    *)__begin2);
  entry = Containers::
          Array<Corrade::Utility::Arguments::Entry,_void_(*)(Corrade::Utility::Arguments::Entry_*,_unsigned_long)>
          ::end((Array<Corrade::Utility::Arguments::Entry,_void_(*)(Corrade::Utility::Arguments::Entry_*,_unsigned_long)>
                 *)__begin2);
  while( true ) {
    if (__end2 == entry) {
      std::__cxx11::string::operator+=((string *)prefix,'-');
      Containers::
      arrayAppend<std::pair<std::__cxx11::string,std::__cxx11::string>,std::__cxx11::string,std::__cxx11::string>
                (&this->_skippedPrefixes,prefix,help);
      return this;
    }
    local_80 = __end2;
    bVar1 = anon_unknown_3::keyHasPrefix(&__end2->key,prefix);
    if (bVar1) break;
    __end2 = __end2 + 1;
  }
  poVar2 = Error::defaultOutput();
  Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_a9);
  Error::Error(&local_a8,poVar2,local_a9);
  pDVar3 = Debug::operator<<(&local_a8.super_Debug,
                             "Utility::Arguments::addSkippedPrefix(): skipped prefix");
  pDVar3 = operator<<<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                     (pDVar3,prefix);
  Debug::operator<<(pDVar3,"conflicts with existing keys");
  Error::~Error(&local_a8);
  abort();
}

Assistant:

Arguments& Arguments::addSkippedPrefix(std::string prefix, std::string help) {
    CORRADE_ASSERT(!skippedPrefix(prefix),
        "Utility::Arguments::addSkippedPrefix(): prefix" << prefix << "already added", *this);

    /* Verify that no already added option conflicts with this */
    #ifndef CORRADE_NO_ASSERT
    for(const Entry& entry: _entries)
        CORRADE_ASSERT(!keyHasPrefix(entry.key, prefix),
            "Utility::Arguments::addSkippedPrefix(): skipped prefix" << prefix << "conflicts with existing keys", *this);
    #endif

    /* Add `-` to the end so we always compare with `--prefix-` and not just
       `--prefix` */
    prefix += '-';

    arrayAppend(_skippedPrefixes, InPlaceInit, std::move(prefix), std::move(help));
    return *this;
}